

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O1

int archive_write_mtree_header(archive_write *a,archive_entry *entry)

{
  undefined8 *puVar1;
  char *fn;
  size_t sVar2;
  unsigned_long uVar3;
  time_t tVar4;
  dev_t dVar5;
  bool bVar6;
  mtree_entry_conflict *me;
  archive_string *dest;
  mode_t mVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int64_t iVar11;
  archive_entry *entry_00;
  time_t t;
  mtree_entry_conflict *pmVar12;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar13;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *__s2;
  long lVar14;
  mtree_entry_conflict *mtree_entry;
  mtree_entry_conflict *file;
  char name [256];
  mtree_entry_conflict *local_190;
  mtree_entry_conflict *local_188;
  int local_17c;
  archive_string local_178;
  archive_string *local_158;
  undefined8 *local_150;
  char *local_148;
  mtree_entry_conflict *local_140;
  char local_138 [264];
  
  puVar1 = (undefined8 *)a->format_data;
  if (*(int *)(puVar1 + 0xe) != 0) {
    *(undefined4 *)(puVar1 + 0xe) = 0;
    archive_strcat((archive_string *)(puVar1 + 0xb),"#mtree\n");
    if ((*(uint *)(puVar1 + 0x1e) & 0x380238) == 0) {
      *(undefined4 *)((long)puVar1 + 0xfc) = 0;
    }
  }
  iVar11 = archive_entry_size(entry);
  puVar1[0xf] = iVar11;
  if ((*(int *)((long)puVar1 + 0xf4) != 0) &&
     (mVar7 = archive_entry_filetype(entry), mVar7 != 0x4000)) {
    return 0;
  }
  iVar8 = mtree_entry_new(a,entry,&local_188);
  me = local_188;
  if (iVar8 < -0x14) {
    return iVar8;
  }
  fn = (char *)a->format_data;
  sVar2 = (local_188->parentdir).length;
  local_150 = puVar1;
  if (sVar2 == 0) {
    if (((local_188->basename).length != 1) || (*(local_188->basename).s != '.')) {
      archive_set_error(&a->archive,-1,
                        "Internal programing error in generating canonical name for %s",
                        (local_188->pathname).s);
LAB_001527b5:
      iVar9 = -0x19;
      goto LAB_00152c49;
    }
    local_188->parent = local_188;
    pmVar12 = *(mtree_entry_conflict **)(fn + 8);
    if (pmVar12 == (mtree_entry_conflict *)0x0) {
      *(mtree_entry_conflict **)(fn + 8) = local_188;
      local_188->next = (mtree_entry_conflict *)0x0;
      **(undefined8 **)(fn + 0x38) = local_188;
      *(mtree_entry_conflict ***)(fn + 0x38) = &local_188->next;
      goto LAB_00152ac8;
    }
  }
  else {
    __s2 = (local_188->parentdir).s;
    pcVar13 = extraout_RDX;
    if ((*(size_t *)(fn + 0x20) == sVar2) &&
       (iVar9 = strcmp(((archive_string *)(fn + 0x18))->s,__s2), pcVar13 = extraout_RDX_00,
       iVar9 == 0)) {
      iVar9 = __archive_rb_tree_insert_node
                        (*(archive_rb_tree **)(*(long *)(fn + 0x10) + 0x28),&me->rbnode);
      local_190 = *(mtree_entry_conflict **)(fn + 0x10);
joined_r0x001529ff:
      if (iVar9 != 0) {
        me->parent = local_190;
        me->next = (mtree_entry_conflict *)0x0;
        **(undefined8 **)(fn + 0x38) = me;
        *(mtree_entry_conflict ***)(fn + 0x38) = &me->next;
LAB_00152ac8:
        iVar9 = 0;
        goto LAB_00152c49;
      }
      pmVar12 = (mtree_entry_conflict *)
                __archive_rb_tree_find_node(&local_190->dir_info->rbtree,(me->basename).s);
    }
    else {
      local_190 = *(mtree_entry_conflict **)(fn + 8);
      local_158 = (archive_string *)(fn + 0x18);
      uVar10 = get_path_component(local_138,(size_t)__s2,pcVar13);
      local_148 = __s2;
      if (uVar10 == 0) {
        pmVar12 = (mtree_entry_conflict *)0x0;
      }
      else {
        pcVar13 = extraout_RDX_01;
        do {
          while( true ) {
            if ((int)uVar10 < 0) {
              archive_set_error(&a->archive,-1,"A name buffer is too small");
              iVar9 = -0x1e;
              goto LAB_00152c49;
            }
            if ((((uVar10 != 1) || (local_138[0] != '.')) ||
                (local_190 == (mtree_entry_conflict *)0x0)) ||
               (local_190 != *(mtree_entry_conflict **)(fn + 8))) break;
            if (__s2[1] == '/') {
              __s2 = __s2 + 2;
            }
            else {
              __s2 = __s2 + 1;
            }
            uVar10 = get_path_component(local_138,(size_t)__s2,pcVar13);
            pcVar13 = extraout_RDX_02;
            if (uVar10 == 0) goto LAB_00152740;
          }
          if (local_190 == (mtree_entry_conflict *)0x0) {
            pmVar12 = (mtree_entry_conflict *)0x0;
          }
          else {
            pmVar12 = (mtree_entry_conflict *)
                      __archive_rb_tree_find_node(&local_190->dir_info->rbtree,local_138);
            pcVar13 = extraout_RDX_03;
          }
          if (pmVar12 == (mtree_entry_conflict *)0x0) break;
          if (*__s2 == '\0') goto LAB_001527ca;
          if (pmVar12->dir_info == (dir_info *)0x0) {
            archive_set_error(&a->archive,-1,"`%s\' is not directory, we cannot insert `%s\' ",
                              (pmVar12->pathname).s,(me->pathname).s);
            goto LAB_001527b5;
          }
          __s2 = __s2 + (ulong)(__s2[uVar10] == '/') + (ulong)uVar10;
          uVar10 = get_path_component(local_138,(size_t)__s2,pcVar13);
          pcVar13 = extraout_RDX_04;
          local_190 = pmVar12;
        } while (uVar10 != 0);
LAB_00152740:
        pmVar12 = (mtree_entry_conflict *)0x0;
      }
LAB_001527ca:
      if (pmVar12 == (mtree_entry_conflict *)0x0) {
        do {
          dest = local_158;
          if (*__s2 == '\0') {
            *(mtree_entry_conflict **)(fn + 0x10) = local_190;
            fn[0x20] = '\0';
            fn[0x21] = '\0';
            fn[0x22] = '\0';
            fn[0x23] = '\0';
            fn[0x24] = '\0';
            fn[0x25] = '\0';
            fn[0x26] = '\0';
            fn[0x27] = '\0';
            archive_string_ensure
                      (local_158,(local_190->parentdir).length + (local_190->basename).length + 2);
            sVar2 = (local_190->parentdir).length;
            if ((local_190->basename).length + sVar2 == 0) {
              *dest->s = '\0';
            }
            else {
              if (sVar2 != 0) {
                fn[0x20] = '\0';
                fn[0x21] = '\0';
                fn[0x22] = '\0';
                fn[0x23] = '\0';
                fn[0x24] = '\0';
                fn[0x25] = '\0';
                fn[0x26] = '\0';
                fn[0x27] = '\0';
                archive_string_concat(dest,&local_190->parentdir);
                archive_strappend_char(dest,'/');
              }
              archive_string_concat(dest,&local_190->basename);
            }
            iVar9 = __archive_rb_tree_insert_node(&local_190->dir_info->rbtree,&me->rbnode);
            goto joined_r0x001529ff;
          }
          lVar14 = (long)(int)uVar10;
          local_178.s = (char *)0x0;
          local_178.length = 0;
          local_178.buffer_length = 0;
          archive_strncat(&local_178,local_148,(size_t)(__s2 + (lVar14 - (long)local_148)));
          pcVar13 = local_178.s;
          if (local_178.s[local_178.length - 1] == '/') {
            local_178.s[local_178.length - 1] = '\0';
            local_178.length = local_178.length - 1;
          }
          entry_00 = archive_entry_new();
          if (entry_00 == (archive_entry *)0x0) {
LAB_0015288d:
            archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
            iVar9 = -0x1e;
            bVar6 = true;
            pmVar12 = (mtree_entry_conflict *)0x0;
          }
          else {
            archive_entry_copy_pathname(entry_00,pcVar13);
            archive_entry_set_mode(entry_00,0x41ed);
            t = time((time_t *)0x0);
            archive_entry_set_mtime(entry_00,t,0);
            iVar9 = mtree_entry_new(a,entry_00,&local_140);
            archive_entry_free(entry_00);
            if (iVar9 < -0x14) goto LAB_0015288d;
            local_140->dir_info->virtual = 1;
            bVar6 = false;
            iVar9 = 0;
            pmVar12 = local_140;
          }
          archive_string_free(&local_178);
          if (bVar6) {
            bVar6 = false;
          }
          else {
            iVar9 = strcmp((pmVar12->pathname).s,".");
            if (iVar9 == 0) {
              pmVar12->parent = pmVar12;
              *(mtree_entry_conflict **)(fn + 8) = pmVar12;
            }
            else {
              __archive_rb_tree_insert_node(&local_190->dir_info->rbtree,&pmVar12->rbnode);
              pmVar12->parent = local_190;
            }
            pmVar12->next = (mtree_entry_conflict *)0x0;
            **(undefined8 **)(fn + 0x38) = pmVar12;
            *(mtree_entry_conflict ***)(fn + 0x38) = &pmVar12->next;
            __s2 = __s2 + (ulong)(__s2[lVar14] == '/') + lVar14;
            uVar10 = get_path_component(local_138,(size_t)__s2,fn);
            if ((int)uVar10 < 0) {
              archive_string_free(&local_178);
              bVar6 = false;
              uVar10 = 0xffffffff;
              archive_set_error(&a->archive,-1,"A name buffer is too small");
              iVar9 = -0x1e;
            }
            else {
              bVar6 = true;
              iVar9 = local_17c;
              local_190 = pmVar12;
            }
          }
          local_17c = iVar9;
        } while (bVar6);
        goto LAB_00152c49;
      }
    }
  }
  uVar10 = me->mode ^ pmVar12->mode;
  if ((uVar10 & 0xf000) == 0) {
    (pmVar12->symlink).length = 0;
    archive_string_concat(&pmVar12->symlink,&me->symlink);
    (pmVar12->uname).length = 0;
    archive_string_concat(&pmVar12->uname,&me->uname);
    (pmVar12->gname).length = 0;
    archive_string_concat(&pmVar12->gname,&me->gname);
    (pmVar12->fflags_text).length = 0;
    archive_string_concat(&pmVar12->fflags_text,&me->fflags_text);
    mVar7 = me->filetype;
    pmVar12->nlink = me->nlink;
    pmVar12->filetype = mVar7;
    pmVar12->mode = me->mode;
    iVar11 = me->uid;
    pmVar12->size = me->size;
    pmVar12->uid = iVar11;
    uVar3 = me->fflags_clear;
    pmVar12->fflags_set = me->fflags_set;
    pmVar12->fflags_clear = uVar3;
    tVar4 = me->mtime;
    pmVar12->gid = me->gid;
    pmVar12->mtime = tVar4;
    pmVar12->mtime_nsec = me->mtime_nsec;
    dVar5 = me->rdevminor;
    pmVar12->rdevmajor = me->rdevmajor;
    pmVar12->rdevminor = dVar5;
    dVar5 = me->devminor;
    pmVar12->devmajor = me->devmajor;
    pmVar12->devminor = dVar5;
    pmVar12->ino = me->ino;
    iVar9 = -0x14;
  }
  else {
    archive_set_error(&a->archive,-1,"Found duplicate entries `%s\' and its file type is different",
                      (pmVar12->pathname).s);
    iVar9 = -0x19;
  }
  if ((uVar10 & 0xf000) == 0) {
    if (pmVar12->dir_info != (dir_info *)0x0) {
      pmVar12->dir_info->virtual = 0;
    }
    local_188 = pmVar12;
    mtree_entry_free(me);
    iVar9 = -0x14;
  }
LAB_00152c49:
  if (iVar9 < -0x14) {
    mtree_entry_free(local_188);
    iVar8 = iVar9;
  }
  else {
    *local_150 = local_188;
    if ((local_188->reg_info != (reg_info *)0x0) &&
       (*(undefined4 *)(local_150 + 0x1c) = 0, (*(byte *)(local_150 + 0x1e) & 1) != 0)) {
      local_150[0x1c] = 1;
      local_150[0x1d] = 0;
    }
  }
  return iVar8;
}

Assistant:

static int
archive_write_mtree_header(struct archive_write *a,
    struct archive_entry *entry)
{
	struct mtree_writer *mtree= a->format_data;
	struct mtree_entry *mtree_entry;
	int r, r2;

	if (mtree->first) {
		mtree->first = 0;
		archive_strcat(&mtree->buf, "#mtree\n");
		if ((mtree->keys & SET_KEYS) == 0)
			mtree->output_global_set = 0;/* Disabled. */
	}

	mtree->entry_bytes_remaining = archive_entry_size(entry);

	/* While directory only mode, we do not handle non directory files. */
	if (mtree->dironly && archive_entry_filetype(entry) != AE_IFDIR)
		return (ARCHIVE_OK);

	r2 = mtree_entry_new(a, entry, &mtree_entry);
	if (r2 < ARCHIVE_WARN)
		return (r2);
	r = mtree_entry_tree_add(a, &mtree_entry);
	if (r < ARCHIVE_WARN) {
		mtree_entry_free(mtree_entry);
		return (r);
	}
	mtree->mtree_entry = mtree_entry;

	/* If the current file is a regular file, we have to
	 * compute the sum of its content.
	 * Initialize a bunch of sum check context. */
	if (mtree_entry->reg_info)
		sum_init(mtree);

	return (r2);
}